

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O0

void __thiscall DIS::IntercomSignalPdu::~IntercomSignalPdu(IntercomSignalPdu *this)

{
  IntercomSignalPdu *this_local;
  
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IntercomSignalPdu_002724c0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_data);
  EntityID::~EntityID(&this->_entityID);
  RadioCommunicationsFamilyPdu::~RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  return;
}

Assistant:

IntercomSignalPdu::~IntercomSignalPdu() { _data.clear(); }